

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_query_id.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CurrentQueryIdBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  idx_t value;
  LogicalType LStack_c8;
  LogicalType local_b0;
  element_type *local_98 [8];
  Value query_id;
  
  LogicalType::LogicalType(&local_b0,SQLNULL);
  Value::Value(&query_id,&local_b0);
  LogicalType::~LogicalType(&local_b0);
  if (bound_function[1].deserialize == (function_deserialize_t)0x0) {
    LogicalType::LogicalType(&LStack_c8,SQLNULL);
    Value::Value((Value *)local_98,&LStack_c8);
    Value::operator=(&query_id,(Value *)local_98);
    Value::~Value((Value *)local_98);
    LogicalType::~LogicalType(&LStack_c8);
  }
  else {
    value = TransactionContext::GetActiveQuery
                      ((TransactionContext *)&bound_function[1].get_modified_databases);
    Value::UBIGINT((Value *)local_98,value);
    Value::operator=(&query_id,(Value *)local_98);
    Value::~Value((Value *)local_98);
  }
  make_uniq<duckdb::CurrentQueryIdData,duckdb::Value&>((duckdb *)local_98,&query_id);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98[0];
  Value::~Value(&query_id);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> CurrentQueryIdBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	Value query_id;
	if (context.transaction.HasActiveTransaction()) {
		query_id = Value::UBIGINT(context.transaction.GetActiveQuery());
	} else {
		query_id = Value();
	}
	return make_uniq<CurrentQueryIdData>(query_id);
}